

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

double calculator::ExpressionParser<__int128>::pow(double __x,double __y)

{
  ulong in_RCX;
  ulong uVar1;
  ulong in_RDX;
  ulong uVar2;
  
  if ((long)(ulong)(in_RDX == 0) <= (long)in_RCX) {
    do {
      uVar1 = in_RCX;
      uVar2 = in_RDX;
      if ((in_RDX & 1) != 0) {
        uVar2 = in_RDX - 1;
        uVar1 = (in_RCX - 1) + (ulong)(in_RDX != 0);
      }
      in_RDX = uVar1 << 0x3f | uVar2 >> 1;
      in_RCX = uVar1 >> 1;
    } while (uVar1 != 0 || -uVar1 < (ulong)(1 < uVar2));
  }
  return __x;
}

Assistant:

static T pow(T x, T n)
  {
    T res = 1;

    while (n > 0)
    {
      if (n % 2 != 0)
      {
        res *= x;
        n -= 1;
      }
      n /= 2;

      if (n > 0)
        x *= x;
    }

    return res;
  }